

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::AppendTlv(Error *__return_storage_ptr__,Message *aMessage,Tlv *aTlv)

{
  bool bVar1;
  Type e;
  Message *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  undefined1 local_15c [3];
  v10 local_159;
  undefined8 local_158;
  char *local_150;
  string local_148;
  Error local_128;
  undefined1 local_f0 [8];
  ByteArray buf;
  Tlv *aTlv_local;
  Message *aMessage_local;
  Error *error;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  undefined8 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this = aMessage;
  Error::Error(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  bVar1 = tlv::Tlv::IsValid(aTlv);
  if (bVar1) {
    tlv::Tlv::Serialize(aTlv,(ByteArray *)local_f0);
    coap::Message::Append(aMessage,(ByteArray *)local_f0);
  }
  else {
    AppendTlv::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)(local_15c + 2));
    local_58 = &local_158;
    local_60 = &local_159;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_150 = (char *)bVar2.size_;
    local_158 = bVar2.data_;
    ::fmt::v10::detail::check_format_string<unsigned_char,_FMT_COMPILE_STRING,_0>();
    e = tlv::Tlv::GetType(aTlv);
    local_15c[0] = utils::to_underlying<ot::commissioner::tlv::Type>(e);
    local_68 = &local_148;
    local_78 = (v10 *)local_158;
    pcStack_70 = local_150;
    local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
                *)local_15c;
    local_50 = &local_78;
    local_90 = (v10 *)local_158;
    local_88 = local_150;
    local_48 = local_90;
    pcStack_40 = local_88;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char>
                               (local_80,(v10 *)this,(uchar *)local_68);
    local_30 = local_a0;
    local_38 = &error;
    local_20 = 2;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 2;
    fmt.data_ = local_88;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_148,local_90,fmt,args);
    Error::Error(&local_128,kInvalidArgs,&local_148);
    Error::operator=(__return_storage_ptr__,&local_128);
    Error::~Error(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f0);
  if ((buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error AppendTlv(coap::Message &aMessage, const tlv::Tlv &aTlv)
{
    Error     error;
    ByteArray buf;

    VerifyOrExit(aTlv.IsValid(),
                 error = ERROR_INVALID_ARGS("the tlv(type={}) is in bad format", utils::to_underlying(aTlv.GetType())));

    aTlv.Serialize(buf);
    aMessage.Append(buf);

exit:
    return error;
}